

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::GenerateXMLHeader(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (this->super_cmCTestGenericHandler).AppendXML);
  cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Build",(allocator<char> *)&local_30);
  cmXMLWriter::StartElement(xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"StartDateTime",(allocator<char> *)&local_30);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&this->StartBuild);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"StartBuildTime",(allocator<char> *)&local_30);
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,&local_50,&this->StartBuildTime);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"BuildCommand",&local_51);
  GetMakeCommand_abi_cxx11_(&local_30,this);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLHeader(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("Build");
  xml.Element("StartDateTime", this->StartBuild);
  xml.Element("StartBuildTime", this->StartBuildTime);
  xml.Element("BuildCommand", this->GetMakeCommand());
}